

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O3

void __thiscall
DenseHashMapMoveTest_Emplace_KeyMoveCount_Test::TestBody
          (DenseHashMapMoveTest_Emplace_KeyMoveCount_Test *this)

{
  pointer ppVar1;
  pair<const_A,_int> pVar2;
  Message local_88;
  AssertHelper local_80;
  pair<google::dense_hashtable_iterator<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>,_bool>
  local_78;
  dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  local_58;
  
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_deleted_ = false;
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.num_ht_copies_ = 0;
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_ = 0.5;
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_factor_ = 0.2;
  local_58.key_info.delkey._i = 0;
  local_58.key_info.empty_key._i = 0;
  local_58.num_deleted = 0;
  local_58.num_elements = 0;
  local_58.num_buckets = 0x20;
  local_58.table = (pointer)0x0;
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_ =
       0x10;
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_ = 6;
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_ = false
  ;
  local_58.settings.super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_ = false;
  local_78.first.ht._0_4_ = 0;
  google::
  dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::set_empty_key(&local_58,(key_type *)&local_78);
  A::copy_ctor = 0;
  A::copy_assign = 0;
  A::move_ctor = 0;
  A::move_assign = 0;
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  local_80.data_._0_4_ = 2;
  google::
  dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::resize_delta(&local_58,1);
  google::
  dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
  ::insert_noresize<int,int,int>
            (&local_78,
             (dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
              *)&local_58,(int *)&local_88,(int *)&local_88,(int *)&local_80);
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_78,"0","A::copy_ctor",(int *)&local_88,&A::copy_ctor);
  ppVar1 = local_78.first.pos;
  if ((char)local_78.first.ht == '\0') {
    testing::Message::Message(&local_88);
    if (local_78.first.pos == (pointer)0x0) {
      pVar2 = (pair<const_A,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar2 = *local_78.first.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
               ,0x151,(char *)pVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_88);
  }
  else {
    if (local_78.first.pos != (pointer)0x0) {
      if (*local_78.first.pos != (pair<const_A,_int>)(local_78.first.pos + 2)) {
        operator_delete((void *)*local_78.first.pos);
      }
      operator_delete(ppVar1);
    }
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_78,"0","A::copy_assign",(int *)&local_88,&A::copy_assign);
    ppVar1 = local_78.first.pos;
    if ((char)local_78.first.ht == '\0') {
      testing::Message::Message(&local_88);
      if (local_78.first.pos == (pointer)0x0) {
        pVar2 = (pair<const_A,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      }
      else {
        pVar2 = *local_78.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0x152,(char *)pVar2);
      testing::internal::AssertHelper::operator=(&local_80,&local_88);
    }
    else {
      if (local_78.first.pos != (pointer)0x0) {
        if (*local_78.first.pos != (pair<const_A,_int>)(local_78.first.pos + 2)) {
          operator_delete((void *)*local_78.first.pos);
        }
        operator_delete(ppVar1);
      }
      local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_78,"0","A::move_ctor",(int *)&local_88,&A::move_ctor);
      ppVar1 = local_78.first.pos;
      if ((char)local_78.first.ht == '\0') {
        testing::Message::Message(&local_88);
        if (local_78.first.pos == (pointer)0x0) {
          pVar2 = (pair<const_A,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
        }
        else {
          pVar2 = *local_78.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x153,(char *)pVar2);
        testing::internal::AssertHelper::operator=(&local_80,&local_88);
      }
      else {
        if (local_78.first.pos != (pointer)0x0) {
          if (*local_78.first.pos != (pair<const_A,_int>)(local_78.first.pos + 2)) {
            operator_delete((void *)*local_78.first.pos);
          }
          operator_delete(ppVar1);
        }
        local_88.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_78,"0","A::move_assign",(int *)&local_88,&A::move_assign);
        if ((char)local_78.first.ht != '\0') goto LAB_00a456a7;
        testing::Message::Message(&local_88);
        if (local_78.first.pos == (pointer)0x0) {
          pVar2 = (pair<const_A,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
        }
        else {
          pVar2 = *local_78.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                   ,0x154,(char *)pVar2);
        testing::internal::AssertHelper::operator=(&local_80,&local_88);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((long *)CONCAT44(local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_88.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
LAB_00a456a7:
  if (local_78.first.pos != (pointer)0x0) {
    if (*local_78.first.pos != (pair<const_A,_int>)(local_78.first.pos + 2)) {
      operator_delete((void *)*local_78.first.pos);
    }
    operator_delete(local_78.first.pos);
  }
  if (local_58.table != (pointer)0x0) {
    free(local_58.table);
  }
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, Emplace_KeyMoveCount)
{
    dense_hash_map<A, int, HashA> h;
    h.set_empty_key(A(0));

    A::reset();
    h.emplace(1, 2);

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}